

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O1

string * __thiscall
llama_vocab::detokenize_abi_cxx11_
          (string *__return_storage_ptr__,llama_vocab *this,
          vector<int,_std::allocator<int>_> *tokens,bool special)

{
  llama_token *plVar1;
  int32_t iVar2;
  ulong uVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = (long)(tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  uVar4 = 0xf;
  if (0xf < uVar3) {
    uVar4 = uVar3;
  }
  ::std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)uVar4);
  plVar1 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar2 = impl::detokenize((this->pimpl)._M_t.
                           super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                           .super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl,plVar1,
                           (int32_t)((ulong)((long)(tokens->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                            (long)plVar1) >> 2),
                           (__return_storage_ptr__->_M_dataplus)._M_p,
                           (int32_t)__return_storage_ptr__->_M_string_length,false,special);
  if (iVar2 < 0) {
    ::std::__cxx11::string::resize((ulong)__return_storage_ptr__,-(char)iVar2);
    plVar1 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    iVar2 = impl::detokenize((this->pimpl)._M_t.
                             super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                             .super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl,plVar1,
                             (int32_t)((ulong)((long)(tokens->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                              (long)plVar1) >> 2),
                             (__return_storage_ptr__->_M_dataplus)._M_p,
                             (int32_t)__return_storage_ptr__->_M_string_length,false,special);
    if ((int)__return_storage_ptr__->_M_string_length < iVar2) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
                 ,0xbef,"GGML_ASSERT(%s) failed","n_chars <= (int32_t)text.size()");
    }
  }
  ::std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)iVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string llama_vocab::detokenize(const std::vector<llama_token> & tokens, bool special) const {
    std::string text;
    text.resize(std::max(text.capacity(), tokens.size()));
    int32_t n_chars = detokenize(tokens.data(), (int32_t)tokens.size(), &text[0], (int32_t)text.size(), false, special);
    if (n_chars < 0) {
        text.resize(-n_chars);
        n_chars = detokenize(tokens.data(), (int32_t)tokens.size(), &text[0], (int32_t)text.size(), false, special);
        GGML_ASSERT(n_chars <= (int32_t)text.size());  // whitespace trimming is performed after per-token detokenization
    }

    text.resize(n_chars);

    // NOTE: the original tokenizer decodes bytes after collecting the pieces.
    return text;
}